

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

void __thiscall SAT::claDecayActivity(SAT *this)

{
  uint uVar1;
  Clause **ppCVar2;
  float *pfVar3;
  long in_RDI;
  uint i;
  uint local_c;
  
  *(double *)(in_RDI + 0x1a0) = *(double *)(in_RDI + 0x1a0) * 1.001;
  if (1e+20 < *(double *)(in_RDI + 0x1a0)) {
    *(double *)(in_RDI + 0x1a0) = *(double *)(in_RDI + 0x1a0) * 1e-20;
    for (local_c = 0; uVar1 = vec<Clause_*>::size((vec<Clause_*> *)(in_RDI + 0x20)), local_c < uVar1
        ; local_c = local_c + 1) {
      ppCVar2 = vec<Clause_*>::operator[]((vec<Clause_*> *)(in_RDI + 0x20),local_c);
      pfVar3 = Clause::activity(*ppCVar2);
      *pfVar3 = *pfVar3 * 1e-20;
    }
  }
  return;
}

Assistant:

inline void SAT::claDecayActivity() {
	// Increase the increment by 0.1%.  This introduces "activity
	// inflation", making all previous activity counts have less value.
	cla_inc *= 1.001;
	// If inflation has become too much, normalise all the activity
	// counts by scaling everything down by a factor of 1e20.
	if (cla_inc > 1e20) {
		cla_inc *= 1e-20;
		for (unsigned int i = 0; i < learnts.size(); i++) {
			learnts[i]->activity() *= 1e-20F;
		}
	}
}